

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytypes.h
# Opt level: O0

tommy_uint_t tommy_ctz_u32(tommy_uint32_t value)

{
  tommy_uint_t tVar1;
  long in_FS_OFFSET;
  tommy_uint32_t value_local;
  
  tVar1 = 0;
  for (; (value & 1) == 0; value = value >> 1 | 0x80000000) {
    tVar1 = tVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return tVar1;
  }
  __stack_chk_fail();
}

Assistant:

tommy_inline tommy_uint_t tommy_ctz_u32(tommy_uint32_t value)
{
#if defined(_MSC_VER)
	unsigned long count;
	_BitScanForward(&count, value);
	return count;
#elif defined(__GNUC__)
	return __builtin_ctz(value);
#else
	/* Count the consecutive zero bits (trailing) on the right with multiply and lookup */
	/* from http://graphics.stanford.edu/~seander/bithacks.html */
	static const unsigned char TOMMY_DE_BRUIJN_INDEX_CTZ[32] = {
		0, 1, 28, 2, 29, 14, 24, 3, 30, 22, 20, 15, 25, 17, 4, 8,
		31, 27, 13, 23, 21, 19, 16, 7, 26, 12, 18, 6, 11, 5, 10, 9
	};

	return TOMMY_DE_BRUIJN_INDEX_CTZ[(tommy_uint32_t)(((value & - value) * 0x077CB531U)) >> 27];
#endif
}